

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits_container_tests.cpp
# Opt level: O0

bool anon_unknown.dwarf_3803e7e::ns::operator==(Value *lhs,Value *rhs)

{
  __type_conflict1 _Var1;
  long in_RSI;
  long in_RDI;
  undefined1 local_11;
  
  _Var1 = std::operator==(&lhs->name,&rhs->name);
  local_11 = false;
  if (_Var1) {
    local_11 = *(int *)(in_RDI + 0x20) == *(int *)(in_RSI + 0x20);
  }
  return local_11;
}

Assistant:

bool operator==(const Value& lhs, const Value& rhs)
        {
            return lhs.name == rhs.name && lhs.value == rhs.value;
        }